

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O0

bool __thiscall
ImPlot::LineStripRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLog>::operator()
          (LineStripRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLog> *this,
          ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  TransformerLogLog *this_00;
  bool bVar1;
  ImVec2 local_70;
  ImVec2 local_68;
  ImRect local_60;
  ImPlotPoint local_50;
  ImVec2 local_3c;
  ImVec2 P2;
  int prim_local;
  ImVec2 *uv_local;
  ImRect *cull_rect_local;
  ImDrawList *DrawList_local;
  LineStripRenderer<ImPlot::GetterXsYs<signed_char>,_ImPlot::TransformerLogLog> *this_local;
  
  this_00 = this->Transformer;
  P2.x = (float)prim;
  unique0x10000103 = uv;
  local_50 = GetterXsYs<signed_char>::operator()(this->Getter,prim + 1);
  local_3c = TransformerLogLog::operator()(this_00,&local_50);
  local_68 = ImMin(&this->P1,&local_3c);
  local_70 = ImMax(&this->P1,&local_3c);
  ImRect::ImRect(&local_60,&local_68,&local_70);
  bVar1 = ImRect::Overlaps(cull_rect,&local_60);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    this->P1 = local_3c;
  }
  else {
    AddLine(&this->P1,&local_3c,this->Weight,this->Col,DrawList,*stack0xffffffffffffffd0);
    this->P1 = local_3c;
  }
  this_local._7_1_ = !bVar1;
  return this_local._7_1_;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P2 = Transformer(Getter(prim + 1));
        if (!cull_rect.Overlaps(ImRect(ImMin(P1, P2), ImMax(P1, P2)))) {
            P1 = P2;
            return false;
        }
        AddLine(P1,P2,Weight,Col,DrawList,uv);
        P1 = P2;
        return true;
    }